

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O2

int duckdb_lz4::LZ4_compress_forceExtDict
              (LZ4_stream_t *LZ4_dict,char *source,char *dest,int srcSize)

{
  dictIssue_directive dictIssue;
  int iVar1;
  
  LZ4_renormDictT(&LZ4_dict->internal_donotuse,srcSize);
  if (((LZ4_dict->internal_donotuse).dictSize < 0x10000) &&
     ((LZ4_dict->internal_donotuse).dictSize < (LZ4_dict->internal_donotuse).currentOffset)) {
    dictIssue = dictSmall;
  }
  else {
    dictIssue = noDictIssue;
  }
  iVar1 = LZ4_compress_generic
                    (&LZ4_dict->internal_donotuse,source,dest,srcSize,(int *)0x0,0,notLimited,byU32,
                     usingExtDict,dictIssue,1);
  (LZ4_dict->internal_donotuse).dictionary = (LZ4_byte *)source;
  (LZ4_dict->internal_donotuse).dictSize = srcSize;
  return iVar1;
}

Assistant:

int LZ4_compress_forceExtDict (LZ4_stream_t* LZ4_dict, const char* source, char* dest, int srcSize)
{
    LZ4_stream_t_internal* streamPtr = &LZ4_dict->internal_donotuse;
    int result;

    LZ4_renormDictT(streamPtr, srcSize);

    if ((streamPtr->dictSize < 64 KB) && (streamPtr->dictSize < streamPtr->currentOffset)) {
        result = LZ4_compress_generic(streamPtr, source, dest, srcSize, NULL, 0, notLimited, byU32, usingExtDict, dictSmall, 1);
    } else {
        result = LZ4_compress_generic(streamPtr, source, dest, srcSize, NULL, 0, notLimited, byU32, usingExtDict, noDictIssue, 1);
    }

    streamPtr->dictionary = (const BYTE*)source;
    streamPtr->dictSize = (U32)srcSize;

    return result;
}